

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O1

void ac_trie_traverse_setfailure(ACT_NODE_t *node,AC_ALPHABET_t *prefix)

{
  ACT_NODE_t *pAVar1;
  ACT_NODE_t *nod;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  pAVar1 = node->trie->root;
  if (pAVar1 != node) {
    if (1 < node->depth) {
      uVar3 = 1;
      uVar2 = 2;
      do {
        nod = pAVar1;
        bVar6 = pAVar1 != (ACT_NODE_t *)0x0;
        if ((pAVar1 != (ACT_NODE_t *)0x0) && (uVar4 = uVar2, uVar3 < node->depth)) {
          do {
            nod = node_find_next(nod,prefix[uVar4 - 1]);
            bVar6 = nod != (ACT_NODE_t *)0x0;
            if (node->depth <= uVar4) break;
            uVar4 = uVar4 + 1;
          } while (nod != (ACT_NODE_t *)0x0);
        }
        if (bVar6) {
          node->failure_node = nod;
          break;
        }
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar3 < node->depth);
    }
    if (node->failure_node == (act_node *)0x0) {
      node->failure_node = pAVar1;
    }
  }
  if (node->outgoing_size != 0) {
    lVar5 = 0;
    uVar2 = 0;
    do {
      prefix[node->depth] = (&node->outgoing->alpha)[lVar5];
      ac_trie_traverse_setfailure(*(ACT_NODE_t **)((long)&node->outgoing->next + lVar5),prefix);
      uVar2 = uVar2 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar2 < node->outgoing_size);
  }
  return;
}

Assistant:

static void ac_trie_traverse_setfailure 
    (ACT_NODE_t *node, AC_ALPHABET_t *prefix)
{
    size_t i;
    
    /* In each node, look for its failure node */
    ac_trie_set_failure (node, prefix);
    
    for (i = 0; i < node->outgoing_size; i++)
    {
        prefix[node->depth] = node->outgoing[i].alpha; /* Make the prefix */
        
        /* Recursively call itself to traverse all nodes */
        ac_trie_traverse_setfailure (node->outgoing[i].next, prefix);
    }
}